

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O1

VendorType parseVendor(StringRef VendorName)

{
  VendorType VVar1;
  VendorType VVar2;
  size_t sVar3;
  int *piVar4;
  bool bVar5;
  bool bVar6;
  
  sVar3 = VendorName.Length;
  piVar4 = (int *)VendorName.Data;
  if (sVar3 == 5) {
    bVar5 = (char)piVar4[1] == 'e' && *piVar4 == 0x6c707061;
  }
  else {
    bVar5 = false;
  }
  VVar2 = Apple;
  if (!bVar5) {
    if (sVar3 == 2) {
      bVar6 = (short)*piVar4 == 0x6370;
    }
    else {
      bVar6 = false;
    }
    VVar2 = bVar6 + Apple;
    bVar5 = true;
    if (bVar6 == false) {
      bVar5 = false;
    }
  }
  if (!bVar5) {
    if (sVar3 == 4) {
      bVar6 = *piVar4 == 0x69656373;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      VVar2 = SCEI;
    }
    bVar5 = true;
    if (!bVar6) {
      bVar5 = false;
    }
  }
  if (!bVar5) {
    if (sVar3 == 3) {
      bVar6 = *(char *)((long)piVar4 + 2) == 'p' && (short)*piVar4 == 0x6762;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      VVar2 = BGP;
    }
    bVar5 = true;
    if (!bVar6) {
      bVar5 = false;
    }
  }
  if (!bVar5) {
    if (sVar3 == 3) {
      bVar6 = *(char *)((long)piVar4 + 2) == 'q' && (short)*piVar4 == 0x6762;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      VVar2 = BGQ;
    }
    bVar5 = true;
    if (!bVar6) {
      bVar5 = false;
    }
  }
  if (!bVar5) {
    if (sVar3 == 3) {
      bVar6 = *(char *)((long)piVar4 + 2) == 'l' && (short)*piVar4 == 0x7366;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      VVar2 = Freescale;
    }
    bVar5 = true;
    if (!bVar6) {
      bVar5 = false;
    }
  }
  if (!bVar5) {
    if (sVar3 == 3) {
      bVar6 = *(char *)((long)piVar4 + 2) == 'm' && (short)*piVar4 == 0x6269;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      VVar2 = IBM;
    }
    bVar5 = true;
    if (!bVar6) {
      bVar5 = false;
    }
  }
  if (!bVar5) {
    if (sVar3 == 3) {
      bVar6 = *(char *)((long)piVar4 + 2) == 'g' && (short)*piVar4 == 0x6d69;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      VVar2 = ImaginationTechnologies;
    }
    bVar5 = true;
    if (!bVar6) {
      bVar5 = false;
    }
  }
  if (!bVar5) {
    if (sVar3 == 3) {
      bVar6 = *(char *)((long)piVar4 + 2) == 'i' && (short)*piVar4 == 0x746d;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      VVar2 = MipsTechnologies;
    }
    bVar5 = true;
    if (!bVar6) {
      bVar5 = false;
    }
  }
  if (!bVar5) {
    if (sVar3 == 6) {
      bVar6 = (short)piVar4[1] == 0x6169 && *piVar4 == 0x6469766e;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      VVar2 = NVIDIA;
    }
    bVar5 = true;
    if (!bVar6) {
      bVar5 = false;
    }
  }
  if (!bVar5) {
    if (sVar3 == 3) {
      bVar6 = *(char *)((long)piVar4 + 2) == 'r' && (short)*piVar4 == 0x7363;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      VVar2 = CSR;
    }
    bVar5 = true;
    if (!bVar6) {
      bVar5 = false;
    }
  }
  if (!bVar5) {
    if (sVar3 == 6) {
      bVar6 = (short)piVar4[1] == 0x6461 && *piVar4 == 0x6972796d;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      VVar2 = Myriad;
    }
    bVar5 = true;
    if (!bVar6) {
      bVar5 = false;
    }
  }
  if (!bVar5) {
    if (sVar3 == 3) {
      bVar6 = *(char *)((long)piVar4 + 2) == 'd' && (short)*piVar4 == 0x6d61;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      VVar2 = AMD;
    }
    bVar5 = true;
    if (!bVar6) {
      bVar5 = false;
    }
  }
  if (!bVar5) {
    if (sVar3 == 4) {
      bVar6 = *piVar4 == 0x6173656d;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      VVar2 = Mesa;
    }
    bVar5 = true;
    if (!bVar6) {
      bVar5 = false;
    }
  }
  if (!bVar5) {
    if (sVar3 == 4) {
      bVar6 = *piVar4 == 0x65737573;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      VVar2 = SUSE;
    }
    bVar5 = true;
    if (!bVar6) {
      bVar5 = false;
    }
  }
  if (!bVar5) {
    if (sVar3 == 2) {
      bVar6 = (short)*piVar4 == 0x656f;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      VVar2 = LastVendorType;
    }
    bVar5 = true;
    if (!bVar6) {
      bVar5 = false;
    }
  }
  VVar1 = UnknownVendor;
  if (bVar5) {
    VVar1 = VVar2;
  }
  return VVar1;
}

Assistant:

bool equals(StringRef RHS) const {
      return (Length == RHS.Length &&
              compareMemory(Data, RHS.Data, RHS.Length) == 0);
    }